

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_help.c
# Opt level: O3

void tool_help(void)

{
  char *pcVar1;
  char *pcVar2;
  helptxt *phVar3;
  
  puts("Usage: curl [options...] <url>");
  phVar3 = helptext;
  pcVar2 = "    --abstract-unix-socket <path>";
  do {
    phVar3 = phVar3 + 1;
    pcVar1 = phVar3->opt;
    printf(" %-19s %s\n",pcVar2,phVar3[-1].desc);
    pcVar2 = pcVar1;
  } while (pcVar1 != (char *)0x0);
  return;
}

Assistant:

void tool_help(void)
{
  int i;
  puts("Usage: curl [options...] <url>");
  for(i = 0; helptext[i].opt; i++) {
    printf(" %-19s %s\n", helptext[i].opt, helptext[i].desc);
#ifdef PRINT_LINES_PAUSE
    if(i && ((i % PRINT_LINES_PAUSE) == 0))
      tool_pressanykey();
#endif
  }
}